

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

int __thiscall QProcessEnvironment::remove(QProcessEnvironment *this,char *__filename)

{
  QProcessEnvironmentPrivate *pQVar1;
  long in_FS_OFFSET;
  QProcessEnvironmentPrivate *p;
  QSharedDataPointer<QProcessEnvironmentPrivate> *in_stack_ffffffffffffffa0;
  Map *this_00;
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QSharedDataPointer<QProcessEnvironmentPrivate>::constData
                     ((QSharedDataPointer<QProcessEnvironmentPrivate> *)0x78f0cf);
  if (pQVar1 != (QProcessEnvironmentPrivate *)0x0) {
    pQVar1 = QSharedDataPointer<QProcessEnvironmentPrivate>::data(in_stack_ffffffffffffffa0);
    this_00 = &pQVar1->vars;
    QProcessEnvironmentPrivate::prepareName
              ((QProcessEnvironmentPrivate *)this,(QString *)__filename);
    QMap<QByteArray,_QProcEnvValue>::remove(this_00,local_20);
    QByteArray::~QByteArray((QByteArray *)0x78f124);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::remove(const QString &name)
{
    if (d.constData()) {
        QProcessEnvironmentPrivate *p = d.data();
        p->vars.remove(p->prepareName(name));
    }
}